

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ManStop(Iso_Man_t *p,int fVerbose)

{
  int level;
  Iso_Man_t *pIVar1;
  double dVar2;
  double dVar3;
  
  if (fVerbose != 0) {
    p->timeOther = p->timeTotal - (p->timeHash + p->timeFout);
    pIVar1 = p;
    Abc_Print((int)p,"%s =","Building ");
    level = (int)pIVar1;
    dVar2 = 0.0;
    if (p->timeTotal != 0) {
      dVar2 = ((double)p->timeFout * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeFout / 1000000.0,dVar2);
    Abc_Print(level,"%s =","Hashing  ");
    dVar3 = (double)(p->timeHash - p->timeSort);
    dVar2 = 0.0;
    if (p->timeTotal != 0) {
      dVar2 = (dVar3 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar3 / 1000000.0,dVar2);
    Abc_Print(level,"%s =","Sorting  ");
    dVar2 = 0.0;
    if (p->timeTotal != 0) {
      dVar2 = ((double)p->timeSort * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSort / 1000000.0,dVar2);
    Abc_Print(level,"%s =","Other    ");
    dVar2 = 0.0;
    if (p->timeTotal != 0) {
      dVar2 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar2);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar2 = (double)p->timeTotal;
    dVar3 = 0.0;
    if (p->timeTotal != 0) {
      dVar3 = (dVar2 * 100.0) / dVar2;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar2 / 1000000.0,dVar3);
  }
  Vec_PtrFree(p->vTemp1);
  Vec_PtrFree(p->vTemp2);
  Vec_PtrFree(p->vClasses);
  Vec_PtrFree(p->vSingles);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  free(p->pObjs);
  free(p);
  return;
}

Assistant:

void Iso_ManStop( Iso_Man_t * p, int fVerbose )
{
    if ( fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeHash - p->timeFout;
        ABC_PRTP( "Building ", p->timeFout,               p->timeTotal );
        ABC_PRTP( "Hashing  ", p->timeHash-p->timeSort,   p->timeTotal );
        ABC_PRTP( "Sorting  ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }
    Vec_PtrFree( p->vTemp1 );
    Vec_PtrFree( p->vTemp2 );
    Vec_PtrFree( p->vClasses );
    Vec_PtrFree( p->vSingles );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}